

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall wabt::interp::Memory::Grow(Memory *this,u32 count)

{
  bool bVar1;
  u32 local_20;
  u32 local_1c;
  u32 new_pages;
  u32 count_local;
  Memory *this_local;
  
  local_1c = count;
  _new_pages = this;
  bVar1 = CanGrow(&(this->type_).limits,this->pages_,count,&local_20);
  if (bVar1) {
    this->pages_ = local_20;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->data_,(ulong)(local_20 << 0x10));
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::Grow(u32 count) {
  u32 new_pages;
  if (CanGrow(type_.limits, pages_, count, &new_pages)) {
    pages_ = new_pages;
    data_.resize(new_pages * WABT_PAGE_SIZE);
    return Result::Ok;
  }
  return Result::Error;
}